

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

ostream * CLI::detail::format_help(ostream *out,string *name,string *description,size_t wid)

{
  char cVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  pointer pcVar4;
  ostream *poVar5;
  long lVar6;
  size_type sVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"  ",name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (name,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  pp_Var2 = out->_vptr_basic_ostream;
  lVar6 = (long)(int)wid;
  *(long *)(&out->field_0x10 + (long)pp_Var2[-3]) = lVar6;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&out->field_0x18 + (long)p_Var3) =
       *(uint *)(&out->field_0x18 + (long)p_Var3) & 0xffffff4f | 0x20;
  ::std::operator<<((ostream *)out,(string *)name);
  sVar8 = description->_M_string_length;
  if (sVar8 != 0) {
    if (wid <= name->_M_string_length) {
      poVar5 = ::std::operator<<((ostream *)out,"\n");
      *(long *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = lVar6;
      ::std::operator<<(poVar5,"");
      sVar8 = description->_M_string_length;
    }
    pcVar4 = (description->_M_dataplus)._M_p;
    for (sVar7 = 0; sVar8 != sVar7; sVar7 = sVar7 + 1) {
      cVar1 = pcVar4[sVar7];
      ::std::ostream::put((char)out);
      if (cVar1 == '\n') {
        *(long *)(&out->field_0x10 + (long)out->_vptr_basic_ostream[-3]) = lVar6;
        ::std::operator<<((ostream *)out,"");
      }
    }
  }
  ::std::operator<<((ostream *)out,"\n");
  return out;
}

Assistant:

inline std::ostream &format_help(std::ostream &out, std::string name, const std::string &description, std::size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << "\n" << std::setw(static_cast<int>(wid)) << "";
        for(const char c : description) {
            out.put(c);
            if(c == '\n') {
                out << std::setw(static_cast<int>(wid)) << "";
            }
        }
    }
    out << "\n";
    return out;
}